

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFillAreaStyleHatching::IfcFillAreaStyleHatching
          (IfcFillAreaStyleHatching *this)

{
  IfcFillAreaStyleHatching *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcFillAreaStyleHatching");
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__010be990);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFillAreaStyleHatching,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFillAreaStyleHatching,_5UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__010be9d8);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10be900;
  *(undefined8 *)&this->field_0x70 = 0x10be978;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10be928;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10be950;
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)
             &(this->super_IfcGeometricRepresentationItem).field_0x30,(LazyObject *)0x0);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->StartOfNextHatchLine);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>::Maybe
            (&this->PointOfReferenceHatchLine);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>::Maybe
            (&this->PatternStart);
  return;
}

Assistant:

IfcFillAreaStyleHatching() : Object("IfcFillAreaStyleHatching") {}